

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

Error * ot::commissioner::JsonFromFile(Error *__return_storage_ptr__,string *aJson,string *aPath)

{
  ErrorCode EVar1;
  Error *pEVar2;
  undefined1 auStack_c8 [40];
  input_adapter local_a0;
  Json json;
  string jsonStr;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  jsonStr._M_dataplus._M_p = (pointer)&jsonStr.field_2;
  jsonStr._M_string_length = 0;
  jsonStr.field_2._M_local_buf[0] = '\0';
  ReadFile((Error *)auStack_c8,&jsonStr,aPath);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)auStack_c8);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(auStack_c8 + 8));
  if (EVar1 == kNone) {
    StripComments((string *)auStack_c8,&jsonStr);
    nlohmann::detail::input_adapter::
    input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_c8);
    local_38 = 0;
    uStack_30 = 0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse(&json,&local_a0,(parser_callback_t *)&local_48,true);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.ia.
                super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)auStack_c8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump((string_t *)auStack_c8,&json,4,' ',false,strict);
    std::__cxx11::string::operator=((string *)aJson,(string *)auStack_c8);
    std::__cxx11::string::~string((string *)auStack_c8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&json);
  }
  std::__cxx11::string::~string((string *)&jsonStr);
  return __return_storage_ptr__;
}

Assistant:

Error JsonFromFile(std::string &aJson, const std::string &aPath)
{
    Error       error;
    std::string jsonStr;

    SuccessOrExit(error = ReadFile(jsonStr, aPath));
    try
    {
        Json json = Json::parse(StripComments(jsonStr));
        aJson     = json.dump(JSON_INDENT_DEFAULT);
    } catch (JsonException &e)
    {
        error = {ErrorCode::kBadFormat, e.GetError().GetMessage()};
    } catch (std::exception &e)
    {
        error = {ErrorCode::kBadFormat, e.what()};
    }
exit:
    return error;
}